

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_descriptor_set_layouts
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *layouts)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  VkDescriptorSetLayoutCreateInfo *pVVar4;
  Pointer pVVar5;
  Ch *str;
  size_type sVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar7;
  VkDescriptorSetLayoutCreateInfo *pVVar8;
  Type pGVar9;
  mapped_type *ppVVar10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *bindings;
  VkDescriptorSetLayoutCreateInfo *info;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  Hash hash;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_48;
  ConstMemberIterator itr;
  uint index;
  VkDescriptorSetLayoutCreateInfo *infos;
  Value *layouts_local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberCount(layouts);
  pVVar4 = ScratchAllocator::allocate_n_cleared<VkDescriptorSetLayoutCreateInfo>
                     (&this->allocator,(ulong)SVar2);
  itr.ptr_._4_4_ = 0;
  local_48.ptr_ =
       (Pointer)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberBegin(layouts);
  do {
    hash = (Hash)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(layouts);
    bVar1 = rapidjson::
            GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator!=((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&local_48,
                         (GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&hash);
    if (!bVar1) {
      (*iface->_vptr_StateCreatorInterface[0x11])();
      return true;
    }
    pVVar5 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator->(&local_48);
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(&pVVar5->name);
    obj = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *)string_to_uint64(str);
    sVar6 = std::
            unordered_map<unsigned_long,_VkDescriptorSetLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>_>
            ::count(&this->replayed_descriptor_set_layouts,(key_type *)&obj);
    if (sVar6 == 0) {
      pVVar5 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(&local_48);
      pGVar7 = &pVVar5->value;
      pVVar8 = pVVar4 + itr.ptr_._4_4_;
      pVVar8->sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pGVar7,"flags");
      uVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar9);
      pVVar8->flags = uVar3;
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(pGVar7,"bindings");
      if (bVar1) {
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)pGVar7,"bindings");
        SVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar9);
        pVVar8->bindingCount = SVar2;
        bVar1 = parse_descriptor_set_bindings(this,iface,resolver,pGVar9,&pVVar8->pBindings);
        if (!bVar1) {
          return false;
        }
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(pGVar7,"pNext");
      if (bVar1) {
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)pGVar7,"pNext");
        bVar1 = parse_pnext_chain(this,pGVar9,&pVVar8->pNext,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar1) {
          return false;
        }
      }
      pGVar7 = obj;
      ppVVar10 = std::
                 unordered_map<unsigned_long,_VkDescriptorSetLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>_>
                 ::operator[](&this->replayed_descriptor_set_layouts,(key_type *)&obj);
      uVar3 = (*iface->_vptr_StateCreatorInterface[6])(iface,pGVar7,pVVar8,ppVVar10);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++(&local_48);
    itr.ptr_._4_4_ = itr.ptr_._4_4_ + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_descriptor_set_layouts(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &layouts)
{
	auto *infos = allocator.allocate_n_cleared<VkDescriptorSetLayoutCreateInfo>(layouts.MemberCount());

	unsigned index = 0;
	for (auto itr = layouts.MemberBegin(); itr != layouts.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_descriptor_set_layouts.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;

		info.flags = obj["flags"].GetUint();
		if (obj.HasMember("bindings"))
		{
			auto &bindings = obj["bindings"];
			info.bindingCount = bindings.Size();
			if (!parse_descriptor_set_bindings(iface, resolver, bindings, &info.pBindings))
				return false;
		}

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &info.pNext))
				return false;

		if (!iface.enqueue_create_descriptor_set_layout(hash, &info, &replayed_descriptor_set_layouts[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}